

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcResponseImpl::~RpcResponseImpl
          (RpcResponseImpl *this)

{
  QuestionRef *pQVar1;
  Disposer *pDVar2;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  IncomingRpcMessage *pIVar6;
  RpcConnectionState *pRVar7;
  
  pQVar1 = (this->questionRef).ptr;
  if (pQVar1 != (QuestionRef *)0x0) {
    (this->questionRef).ptr = (QuestionRef *)0x0;
    pDVar2 = (this->questionRef).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pQVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pQVar1->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  (this->capTable).super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_00641d60;
  pMVar3 = (this->capTable).table.ptr;
  if (pMVar3 != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    sVar4 = (this->capTable).table.size_;
    (this->capTable).table.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    (this->capTable).table.size_ = 0;
    pAVar5 = (this->capTable).table.disposer;
    (**pAVar5->_vptr_ArrayDisposer)
              (pAVar5,pMVar3,0x10,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct)
    ;
  }
  pIVar6 = (this->message).ptr;
  if (pIVar6 != (IncomingRpcMessage *)0x0) {
    (this->message).ptr = (IncomingRpcMessage *)0x0;
    pDVar2 = (this->message).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pIVar6->_vptr_IncomingRpcMessage[-2] + (long)&pIVar6->_vptr_IncomingRpcMessage
              );
  }
  pRVar7 = (this->connectionState).ptr;
  if (pRVar7 != (RpcConnectionState *)0x0) {
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    pDVar2 = (this->connectionState).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pRVar7->super_ErrorHandler)._vptr_ErrorHandler[-2] +
                      (long)&(pRVar7->super_ErrorHandler)._vptr_ErrorHandler);
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  ResponseHook::~ResponseHook((ResponseHook *)this);
  return;
}

Assistant:

RpcResponseImpl(RpcConnectionState& connectionState,
                    kj::Own<QuestionRef>&& questionRef,
                    kj::Own<IncomingRpcMessage>&& message,
                    kj::Array<kj::Maybe<kj::Own<ClientHook>>> capTableArray,
                    AnyPointer::Reader results)
        : connectionState(kj::addRef(connectionState)),
          message(kj::mv(message)),
          capTable(kj::mv(capTableArray)),
          reader(capTable.imbue(results)),
          questionRef(kj::mv(questionRef)) {}